

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

void __thiscall
trun::TestResponseProxy::Abort(TestResponseProxy *this,int line,char *file,string *message)

{
  ILogger *pIVar1;
  string *psVar2;
  uint uVar3;
  char *pcVar4;
  string local_80;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *message_local;
  char *file_local;
  TestResponseProxy *pTStack_10;
  int line_local;
  TestResponseProxy *this_local;
  
  pIVar1 = this->pLogger;
  local_28 = message;
  message_local = (string *)file;
  file_local._4_4_ = line;
  pTStack_10 = this;
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (message);
  (*pIVar1->_vptr_ILogger[7])(pIVar1,"Abort Error: %s:%d\t\'%s\'",file,(ulong)(uint)line,pcVar4);
  uVar3 = file_local._4_4_;
  psVar2 = message_local;
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (message);
  printf("*** ABORT ERROR: %s:%d\t\'%s\'\n",psVar2,(ulong)uVar3,pcVar4);
  uVar3 = file_local._4_4_;
  psVar2 = message_local;
  this->errorCount = this->errorCount + 1;
  if (this->testResult < kTestResult_AllFail) {
    this->testResult = kTestResult_AllFail;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,(char *)psVar2,&local_49);
  std::__cxx11::string::string((string *)&local_80,message);
  trun::AssertError::Add(&this->assertError,kAssert_Abort,uVar3,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  TerminateThreadIfNeeded(this);
  return;
}

Assistant:

void TestResponseProxy::Abort(int line, const char *file, std::string message) {
    pLogger->Debug("Abort Error: %s:%d\t'%s'", file, line, message.c_str());

    printf("*** ABORT ERROR: %s:%d\t'%s'\n", file, line, message.c_str());
    this->errorCount++;
    if (testResult < kTestResult_AllFail) {
        testResult = kTestResult_AllFail;
    }
    assertError.Add(AssertError::kAssert_Abort, line, file, message);
    TerminateThreadIfNeeded();
}